

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O0

void __thiscall Track::insert(Track *this,int index,Sector *sector)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  exception *this_00;
  const_iterator local_48;
  __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_40;
  __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_38;
  __normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> it;
  Sector *sector_local;
  int index_local;
  Track *this_local;
  
  sVar2 = std::vector<Sector,_std::allocator<Sector>_>::size(&this->m_sectors);
  if ((int)sVar2 < index) {
    __assert_fail("index <= static_cast<int>(m_sectors.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Track.cpp"
                  ,0x121,"void Track::insert(int, Sector &&)");
  }
  bVar1 = std::vector<Sector,_std::allocator<Sector>_>::empty(&this->m_sectors);
  if (!bVar1) {
    pvVar3 = std::vector<Sector,_std::allocator<Sector>_>::operator[](&this->m_sectors,0);
    if (pvVar3->datarate != sector->datarate) {
      this_00 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[31]>
                (this_00,(char (*) [31])"can\'t mix datarates on a track");
      __cxa_throw(this_00,&util::exception::typeinfo,util::exception::~exception);
    }
  }
  local_40._M_current =
       (Sector *)std::vector<Sector,_std::allocator<Sector>_>::begin(&this->m_sectors);
  local_38 = __gnu_cxx::__normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
             operator+(&local_40,(long)index);
  __gnu_cxx::__normal_iterator<Sector_const*,std::vector<Sector,std::allocator<Sector>>>::
  __normal_iterator<Sector*>
            ((__normal_iterator<Sector_const*,std::vector<Sector,std::allocator<Sector>>> *)
             &local_48,&local_38);
  std::vector<Sector,_std::allocator<Sector>_>::insert(&this->m_sectors,local_48,sector);
  return;
}

Assistant:

void Track::insert(int index, Sector&& sector)
{
    assert(index <= static_cast<int>(m_sectors.size()));

    if (!m_sectors.empty() && m_sectors[0].datarate != sector.datarate)
        throw util::exception("can't mix datarates on a track");

    auto it = m_sectors.begin() + index;
    m_sectors.insert(it, std::move(sector));
}